

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

ExtPrivkey * __thiscall
cfd::core::ExtPrivkey::DerivePrivkey
          (ExtPrivkey *__return_storage_ptr__,ExtPrivkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  uint flags;
  uchar *puVar1;
  size_type sVar2;
  CfdException *pCVar3;
  uint *child_path;
  ByteData local_340;
  ByteData256 local_328;
  allocator<unsigned_char> local_309;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tweak_sum;
  ByteData256 tweak_sum_data;
  string local_2d0;
  CfdSourceLocation local_2b0;
  allocator<unsigned_char> local_291;
  undefined1 local_290 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string local_270;
  CfdSourceLocation local_250;
  uint local_234;
  undefined1 local_230 [4];
  uint32_t flag;
  undefined1 local_212;
  allocator local_211;
  string local_210;
  CfdSourceLocation local_1f0;
  int local_1c4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c0 [4];
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_1a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data;
  ext_key child_key;
  ext_key extkey;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *path_local;
  ExtPrivkey *this_local;
  
  extkey.pub_key_tweak_sum._24_8_ = path;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,
                     &this->serialize_data_);
  local_1a8 = local_1c0;
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1c0);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1a8);
  local_1c4 = bip32_key_unserialize(puVar1,sVar2,(ext_key *)(child_key.pub_key_tweak_sum + 0x18));
  if (local_1c4 != 0) {
    local_1f0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_1f0.filename = local_1f0.filename + 1;
    local_1f0.line = 0x274;
    local_1f0.funcname = "DerivePrivkey";
    logger::warn<int&>(&local_1f0,"bip32_key_unserialize error. ret={}",&local_1c4);
    local_212 = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_210,"ExtPrivkey unserialize error.",&local_211);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_210);
    local_212 = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::GetBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230,&this->tweak_sum_);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230);
  extkey.pub_key._25_8_ = *(undefined8 *)puVar1;
  extkey.pub_key_tweak_sum._0_8_ = *(undefined8 *)(puVar1 + 8);
  extkey.pub_key_tweak_sum._8_8_ = *(undefined8 *)(puVar1 + 0x10);
  extkey.pub_key_tweak_sum._16_8_ = *(undefined8 *)(puVar1 + 0x18);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_230);
  local_234 = 0;
  child_path = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          extkey.pub_key_tweak_sum._24_8_);
  sVar2 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     extkey.pub_key_tweak_sum._24_8_);
  local_1c4 = bip32_key_from_parent_path
                        ((ext_key *)(child_key.pub_key_tweak_sum + 0x18),child_path,sVar2,
                         local_234 | 4,(ext_key *)&serialize_data);
  if (local_1c4 != 0) {
    local_250.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_250.filename = local_250.filename + 1;
    local_250.line = 0x284;
    local_250.funcname = "DerivePrivkey";
    logger::warn<int&>(&local_250,"bip32_key_from_parent_path error. ret={}",&local_1c4);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_270,"ExtPrivkey derive error.",
               (allocator *)
               ((long)&data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_270);
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ::std::allocator<unsigned_char>::allocator(&local_291);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290,0x4e,&local_291);
  ::std::allocator<unsigned_char>::~allocator(&local_291);
  flags = local_234;
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  local_1c4 = bip32_key_serialize((ext_key *)&serialize_data,flags,puVar1,sVar2);
  if (local_1c4 != 0) {
    local_2b0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_hdwallet.cpp"
                 ,0x2f);
    local_2b0.filename = local_2b0.filename + 1;
    local_2b0.line = 0x28c;
    local_2b0.funcname = "DerivePrivkey";
    logger::warn<int&>(&local_2b0,"bip32_key_serialize error. ret={}",&local_1c4);
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_2d0,"ExtPrivkey serialize error.",
               (allocator *)
               ((long)&tweak_sum_data.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,&local_2d0);
    tweak_sum_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData256::ByteData256
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<unsigned_char>::allocator(&local_309);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_308,0x20,&local_309);
  ::std::allocator<unsigned_char>::~allocator(&local_309);
  puVar1 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_308);
  sVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_308);
  memcpy(puVar1,extkey.pub_key + 0x19,sVar2);
  ByteData256::ByteData256
            (&local_328,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308);
  ByteData256::operator=
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,&local_328);
  ByteData256::~ByteData256(&local_328);
  ByteData::ByteData(&local_340,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  ExtPrivkey(__return_storage_ptr__,&local_340,
             (ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ByteData::~ByteData(&local_340);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_308);
  ByteData256::~ByteData256
            ((ByteData256 *)
             &tweak_sum.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_290);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_1c0);
  return __return_storage_ptr__;
}

Assistant:

ExtPrivkey ExtPrivkey::DerivePrivkey(const std::vector<uint32_t>& path) const {
  struct ext_key extkey;
  struct ext_key child_key;

  const std::vector<uint8_t>& serialize_data = serialize_data_.GetBytes();
  int ret = bip32_key_unserialize(
      serialize_data.data(), serialize_data.size(), &extkey);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_unserialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey unserialize error.");
  }

#ifndef CFD_DISABLE_ELEMENTS
  // write pub_key_tweak_sum to ext_key
  memcpy(
      extkey.pub_key_tweak_sum, tweak_sum_.GetBytes().data(),
      sizeof(extkey.pub_key_tweak_sum));
#endif  // CFD_DISABLE_ELEMENTS
  uint32_t flag = BIP32_FLAG_KEY_PRIVATE;
  ret = bip32_key_from_parent_path(
      &extkey, path.data(), path.size(), flag | BIP32_FLAG_KEY_TWEAK_SUM,
      &child_key);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_from_parent_path error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey derive error.");
  }

  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN);
  ret = bip32_key_serialize(&child_key, flag, data.data(), data.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "bip32_key_serialize error. ret={}", ret);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "ExtPrivkey serialize error.");
  }

  ByteData256 tweak_sum_data;
#ifndef CFD_DISABLE_ELEMENTS
  // collect pub_key_tweak_sum from ext_key
  std::vector<uint8_t> tweak_sum(sizeof(extkey.pub_key_tweak_sum));
  memcpy(tweak_sum.data(), extkey.pub_key_tweak_sum, tweak_sum.size());
  tweak_sum_data = ByteData256(tweak_sum);
#endif  // CFD_DISABLE_ELEMENTS
  return ExtPrivkey(ByteData(data), tweak_sum_data);
}